

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::test
          (AttachmentSizeInitialCase *this)

{
  int g;
  int b;
  TestContext *pTVar1;
  bool bVar2;
  int iVar3;
  PixelFormat *pPVar4;
  RenderTarget *pRVar5;
  AttachmentSizeInitialCase *this_local;
  
  bVar2 = attachmentExists(this,0x405);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    pPVar4 = tcu::RenderTarget::getPixelFormat(pRVar5);
    iVar3 = pPVar4->redBits;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    pPVar4 = tcu::RenderTarget::getPixelFormat(pRVar5);
    g = pPVar4->greenBits;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    pPVar4 = tcu::RenderTarget::getPixelFormat(pRVar5);
    b = pPVar4->blueBits;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    pPVar4 = tcu::RenderTarget::getPixelFormat(pRVar5);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x405,iVar3,g,b,
               pPVar4->alphaBits,-1,-1);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  bVar2 = attachmentExists(this,0x1801);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    iVar3 = tcu::RenderTarget::getDepthBits(pRVar5);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x1801,-1,-1,-1,-1,iVar3,-1
              );
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  bVar2 = attachmentExists(this,0x1802);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    iVar3 = tcu::RenderTarget::getStencilBits(pRVar5);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x1802,-1,-1,-1,-1,-1,iVar3
              );
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		// check default
		if (attachmentExists(GL_BACK))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_BACK,
				m_context.getRenderTarget().getPixelFormat().redBits,
				m_context.getRenderTarget().getPixelFormat().greenBits,
				m_context.getRenderTarget().getPixelFormat().blueBits,
				m_context.getRenderTarget().getPixelFormat().alphaBits,
				-1,
				-1);
			expectError(GL_NO_ERROR);
		}

		if (attachmentExists(GL_DEPTH))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_DEPTH,
				-1,
				-1,
				-1,
				-1,
				m_context.getRenderTarget().getDepthBits(),
				-1);
			expectError(GL_NO_ERROR);
		}

		if (attachmentExists(GL_STENCIL))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_STENCIL,
				-1,
				-1,
				-1,
				-1,
				-1,
				m_context.getRenderTarget().getStencilBits());
			expectError(GL_NO_ERROR);
		}
	}